

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

void __thiscall cmFileInstaller::cmFileInstaller(cmFileInstaller *this,cmFileCommand *command)

{
  cmMakefile *this_00;
  bool bVar1;
  char *pcVar2;
  allocator local_49;
  string local_48;
  cmFileCommand *local_18;
  cmFileCommand *command_local;
  cmFileInstaller *this_local;
  
  local_18 = command;
  command_local = (cmFileCommand *)this;
  cmFileCopier::cmFileCopier(&this->super_cmFileCopier,command,"INSTALL");
  (this->super_cmFileCopier)._vptr_cmFileCopier = (_func_int **)&PTR__cmFileInstaller_00a51790;
  *(undefined4 *)&(this->super_cmFileCopier).field_0xa4 = 4;
  this->Optional = false;
  this->MessageAlways = false;
  this->MessageLazy = false;
  this->MessageNever = false;
  this->DestDirLength = 0;
  std::__cxx11::string::string((string *)&this->Rename);
  std::__cxx11::string::string((string *)&this->Manifest);
  (this->super_cmFileCopier).UseSourcePermissions = false;
  pcVar2 = cmsys::SystemTools::GetEnv("CMAKE_INSTALL_ALWAYS");
  bVar1 = cmSystemTools::IsOn(pcVar2);
  (this->super_cmFileCopier).Always = bVar1;
  this_00 = (this->super_cmFileCopier).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"CMAKE_INSTALL_MANIFEST_FILES",&local_49);
  pcVar2 = cmMakefile::GetSafeDefinition(this_00,&local_48);
  std::__cxx11::string::operator=((string *)&this->Manifest,pcVar2);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return;
}

Assistant:

cmFileInstaller(cmFileCommand* command):
    cmFileCopier(command, "INSTALL"),
    InstallType(cmInstallType_FILES),
    Optional(false),
    MessageAlways(false),
    MessageLazy(false),
    MessageNever(false),
    DestDirLength(0)
    {
    // Installation does not use source permissions by default.
    this->UseSourcePermissions = false;
    // Check whether to copy files always or only if they have changed.
    this->Always =
      cmSystemTools::IsOn(cmSystemTools::GetEnv("CMAKE_INSTALL_ALWAYS"));
    // Get the current manifest.
    this->Manifest =
      this->Makefile->GetSafeDefinition("CMAKE_INSTALL_MANIFEST_FILES");
    }